

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O2

bool UTF_uc32_to_uc16(UTF_UC32 uc32,UTF_UC16 *uc16)

{
  UTF_UC16 UVar1;
  
  if ((uint)uc32 < 0x110000) {
    if ((uint)uc32 < 0x10000) {
      *uc16 = (UTF_UC16)uc32;
      UVar1 = L'\0';
    }
    else {
      *uc16 = (short)((uint)(uc32 + L'\x03ff0000') >> 10) + L'\xd800';
      UVar1 = (UTF_UC16)uc32 & 0x3ffU | 0xdc00;
    }
    uc16[1] = UVar1;
  }
  return (uint)uc32 < 0x110000;
}

Assistant:

static __inline bool
UTF_uc32_to_uc16(UTF_UC32 uc32, UTF_UC16 uc16[2])
{
    if (uc32 > 0x10FFFF)
        return false;

    if (uc32 < 0x10000)
    {
        uc16[0] = UTF_STATIC_CAST(UTF_UC16, uc32);
        uc16[1] = 0;
    }
    else
    {
        uc16[0] = UTF_STATIC_CAST(UTF_UC16, (uc32 - 0x10000) / 0x400 + 0xD800);
        uc16[1] = UTF_STATIC_CAST(UTF_UC16, (uc32 - 0x10000) % 0x400 + 0xDC00);
    }

    return true;
}